

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr_ptr.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4b88::QSBRPtr_LessThan_Test::TestBody(QSBRPtr_LessThan_Test *this)

{
  qsbr_ptr<const_char> qVar1;
  char *in_R9;
  qsbr_ptr<const_char> local_90;
  qsbr_ptr<const_char> local_88;
  qsbr_ptr<const_char> local_80;
  internal local_78 [8];
  AssertionResult gtest_ar_;
  qsbr_ptr<const_char> local_48;
  qsbr_ptr<const_char> ptr1;
  qsbr_ptr<const_char> ptr2;
  AssertHelper local_30;
  
  unodb::qsbr_ptr<const_char>::qsbr_ptr
            (&local_48,
             "ABN7testing8internal15TestFactoryImplIN12_GLOBAL__N_125QSBRPtr_Preincrement_TestEEE");
  unodb::qsbr_ptr<const_char>::qsbr_ptr
            (&ptr1,(pointer)((long)&(anonymous_namespace)::two_chars + 1));
  unodb::qsbr_ptr<const_char>::qsbr_ptr(&local_90,&local_48);
  qVar1.ptr = local_48.ptr;
  local_78[0] = (internal)(local_90.ptr <= local_48.ptr);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  unodb::qsbr_ptr<const_char>::~qsbr_ptr(&local_90);
  if (qVar1.ptr < local_90.ptr) {
    testing::Message::Message((Message *)&ptr2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,local_78,(AssertionResult *)"ptr1 < ptr1","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
               ,0x15d,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&ptr2);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    unodb::qsbr_ptr<const_char>::qsbr_ptr(&local_88,&ptr1);
    local_78[0] = (internal)(local_48.ptr < local_88.ptr);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    unodb::qsbr_ptr<const_char>::~qsbr_ptr(&local_88);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&ptr2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_.message_,local_78,(AssertionResult *)"ptr1 < ptr2","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
                 ,0x15e,(char *)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&ptr2);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      unodb::qsbr_ptr<const_char>::qsbr_ptr(&local_80,&local_48);
      local_78[0] = (internal)(local_80.ptr <= ptr1.ptr);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      unodb::qsbr_ptr<const_char>::~qsbr_ptr(&local_80);
      if (local_80.ptr <= ptr1.ptr) goto LAB_00113ed0;
      testing::Message::Message((Message *)&ptr2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_.message_,local_78,(AssertionResult *)"ptr2 < ptr1","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr_ptr.cpp"
                 ,0x15f,(char *)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&ptr2);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  if (ptr2.ptr != (pointer)0x0) {
    (**(code **)(*(long *)ptr2.ptr + 8))();
  }
LAB_00113ed0:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::qsbr_ptr<const_char>::~qsbr_ptr(&ptr1);
  unodb::qsbr_ptr<const_char>::~qsbr_ptr(&local_48);
  return;
}

Assistant:

UNODB_TEST(QSBRPtr, LessThan) {
  // NOLINTNEXTLINE(readability-container-data-pointer)
  const unodb::qsbr_ptr<const char> ptr1{&two_chars[0]};
  const unodb::qsbr_ptr<const char> ptr2{&two_chars[1]};

  UNODB_ASSERT_FALSE(ptr1 < ptr1);
  UNODB_ASSERT_TRUE(ptr1 < ptr2);
  UNODB_ASSERT_FALSE(ptr2 < ptr1);
}